

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.cpp
# Opt level: O1

bool __thiscall miniros::Transport::isHostAllowed(Transport *this,string *host)

{
  ulong uVar1;
  pointer pbVar2;
  pointer __s1;
  size_t __n;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  string local_90;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  bVar6 = true;
  if (this->only_localhost_allowed_ != true) {
    return true;
  }
  uVar1 = host->_M_string_length;
  if (3 < uVar1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)host);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"127.","");
    if (local_68 == local_48) {
      if (local_68 == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_70,local_50,local_68);
        bVar5 = iVar3 == 0;
      }
      goto LAB_0021ec73;
    }
  }
  bVar5 = false;
LAB_0021ec73:
  if (3 < uVar1) {
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  if (!bVar5) {
    pbVar4 = (this->allowed_hosts_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->allowed_hosts_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = pbVar4 == pbVar2;
    if (!bVar6) {
      __s1 = (host->_M_dataplus)._M_p;
      __n = host->_M_string_length;
      do {
        if ((__n == pbVar4->_M_string_length) &&
           ((__n == 0 || (iVar3 = bcmp(__s1,(pbVar4->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
          if (!bVar6) {
            return true;
          }
          break;
        }
        pbVar4 = pbVar4 + 1;
        bVar6 = pbVar4 == pbVar2;
      } while (!bVar6);
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (isHostAllowed::loc.initialized_ == false) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"miniros.unknown_package","");
      console::initializeLogLocation(&isHostAllowed::loc,&local_90,Warn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    if (isHostAllowed::loc.level_ != Warn) {
      isHostAllowed();
    }
    if (isHostAllowed::loc.logger_enabled_ == true) {
      isHostAllowed();
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Transport::isHostAllowed(const std::string &host) const
{
  if (!only_localhost_allowed_)
    return true; // doesn't matter; we'll connect to anybody

  if (host.length() >= 4 && host.substr(0, 4) == std::string("127."))
    return true; // ipv4 localhost
  // now, loop through the list of valid hostnames and see if we find it
  for (std::vector<std::string>::const_iterator it = allowed_hosts_.begin(); 
       it != allowed_hosts_.end(); ++it)
  {
    if (host == *it)
      return true; // hooray
  }
  MINIROS_WARN("ROS_HOSTNAME / ROS_IP is set to only allow local connections, so "
           "a requested connection to '%s' is being rejected.", host.c_str());
  return false; // sadness
}